

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_fileno(uv_handle_t *handle,uv_os_fd_t *fd)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = handle->type - UV_NAMED_PIPE;
  iVar2 = -0x16;
  if ((uVar3 < 9) && ((0x1a3U >> (uVar3 & 0x1f) & 1) != 0)) {
    iVar2 = -9;
    if (((handle->flags & 3) == 0) &&
       (iVar1 = *(int *)((long)handle->handle_queue +
                        *(long *)(&DAT_0069b0f0 + (ulong)uVar3 * 8) + -0x20), iVar1 != -1)) {
      *fd = iVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int uv_fileno(const uv_handle_t* handle, uv_os_fd_t* fd) {
  int fd_out;

  switch (handle->type) {
  case UV_TCP:
  case UV_NAMED_PIPE:
  case UV_TTY:
    fd_out = uv__stream_fd((uv_stream_t*) handle);
    break;

  case UV_UDP:
    fd_out = ((uv_udp_t *) handle)->io_watcher.fd;
    break;

  case UV_POLL:
    fd_out = ((uv_poll_t *) handle)->io_watcher.fd;
    break;

  default:
    return UV_EINVAL;
  }

  if (uv__is_closing(handle) || fd_out == -1)
    return UV_EBADF;

  *fd = fd_out;
  return 0;
}